

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,DistantLight *light,uint32_t indent,
          bool closing_brace)

{
  bool bVar1;
  ostream *poVar2;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *attr;
  TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *pTVar3;
  TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *pTVar4;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *attr_00;
  TypedAttributeWithFallback<tinyusdz::Purpose> *attr_01;
  uint32_t indent_00;
  uint32_t uVar5;
  string *psVar6;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  allocator local_579;
  string local_578;
  string local_558;
  allocator local_531;
  string local_530;
  string local_510;
  allocator local_4e9;
  string local_4e8;
  string local_4c8;
  allocator local_4a1;
  string local_4a0;
  string local_480;
  allocator local_459;
  string local_458;
  string local_438;
  allocator local_411;
  string local_410;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  string local_3a8;
  allocator local_381;
  string local_380;
  string local_360;
  allocator local_339;
  string local_338;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [379];
  byte local_1d;
  uint local_1c;
  bool closing_brace_local;
  tinyusdz *ptStack_18;
  uint32_t indent_local;
  DistantLight *light_local;
  
  local_1c = (uint)light;
  local_1d = (byte)indent & 1;
  psVar6 = __return_storage_ptr__;
  ptStack_18 = this;
  light_local = (DistantLight *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  indent_00 = (uint32_t)psVar6;
  pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
  to_string_abi_cxx11_(&local_1e8,(tinyusdz *)(ulong)*(uint *)(ptStack_18 + 0x108),s);
  poVar2 = ::std::operator<<(poVar2,(string *)&local_1e8);
  poVar2 = ::std::operator<<(poVar2," DistantLight \"");
  poVar2 = ::std::operator<<(poVar2,(string *)(ptStack_18 + 0xe8));
  ::std::operator<<(poVar2,"\"\n");
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  bVar1 = PrimMetas::authored((PrimMetas *)(ptStack_18 + 0x1ac8));
  uVar5 = n_00;
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)(ulong)local_1c,n_00);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_208);
    ::std::operator<<(poVar2,"(\n");
    ::std::__cxx11::string::~string((string *)&local_208);
    print_prim_metas_abi_cxx11_
              (&local_228,ptStack_18 + 0x1ac8,(PrimMeta *)(ulong)(local_1c + 1),indent_00);
    ::std::operator<<(aoStack_198,(string *)&local_228);
    ::std::__cxx11::string::~string((string *)&local_228);
    pprint::Indent_abi_cxx11_(&local_248,(pprint *)(ulong)local_1c,n_01);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_248);
    ::std::operator<<(poVar2,")\n");
    ::std::__cxx11::string::~string((string *)&local_248);
    uVar5 = extraout_EDX;
  }
  pprint::Indent_abi_cxx11_(&local_268,(pprint *)(ulong)local_1c,uVar5);
  poVar2 = ::std::operator<<(aoStack_198,(string *)&local_268);
  ::std::operator<<(poVar2,"{\n");
  ::std::__cxx11::string::~string((string *)&local_268);
  attr = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
         (ptStack_18 + 0x5d8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2a8,"inputs:color",&local_2a9);
  print_typed_attr<tinyusdz::value::color3f>(&local_288,attr,&local_2a8,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_288);
  ::std::__cxx11::string::~string((string *)&local_288);
  ::std::__cxx11::string::~string((string *)&local_2a8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  pTVar3 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x870);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2f0,"inputs:colorTemperature",&local_2f1);
  print_typed_attr<float>(&local_2d0,pTVar3,&local_2f0,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_2d0);
  ::std::__cxx11::string::~string((string *)&local_2d0);
  ::std::__cxx11::string::~string((string *)&local_2f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  pTVar3 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0xaf8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_338,"inputs:diffuse",&local_339);
  print_typed_attr<float>(&local_318,pTVar3,&local_338,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_318);
  ::std::__cxx11::string::~string((string *)&local_318);
  ::std::__cxx11::string::~string((string *)&local_338);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
  pTVar4 = (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)(ptStack_18 + 0xd80);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_380,"inputs:enableColorTemperature",&local_381);
  print_typed_attr<bool>(&local_360,pTVar4,&local_380,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_360);
  ::std::__cxx11::string::~string((string *)&local_360);
  ::std::__cxx11::string::~string((string *)&local_380);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
  pTVar3 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x1008);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_3c8,"inputs:exposure",&local_3c9);
  print_typed_attr<float>(&local_3a8,pTVar3,&local_3c8,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_3a8);
  ::std::__cxx11::string::~string((string *)&local_3a8);
  ::std::__cxx11::string::~string((string *)&local_3c8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  pTVar3 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x1290);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_410,"inputs:intensity",&local_411);
  print_typed_attr<float>(&local_3f0,pTVar3,&local_410,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_3f0);
  ::std::__cxx11::string::~string((string *)&local_3f0);
  ::std::__cxx11::string::~string((string *)&local_410);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_411);
  pTVar4 = (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *)(ptStack_18 + 0x1518);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_458,"inputs:normalize",&local_459);
  print_typed_attr<bool>(&local_438,pTVar4,&local_458,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_438);
  ::std::__cxx11::string::~string((string *)&local_438);
  ::std::__cxx11::string::~string((string *)&local_458);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_459);
  pTVar3 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x17a0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_4a0,"inputs:specular",&local_4a1);
  print_typed_attr<float>(&local_480,pTVar3,&local_4a0,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_480);
  ::std::__cxx11::string::~string((string *)&local_480);
  ::std::__cxx11::string::~string((string *)&local_4a0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  pTVar3 = (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(ptStack_18 + 0x1ef0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_4e8,"inputs:angle",&local_4e9);
  print_typed_attr<float>(&local_4c8,pTVar3,&local_4e8,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_4c8);
  ::std::__cxx11::string::~string((string *)&local_4c8);
  ::std::__cxx11::string::~string((string *)&local_4e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  attr_00 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
            (ptStack_18 + 0x118);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_530,"visibility",&local_531);
  print_typed_token_attr<tinyusdz::Visibility>(&local_510,attr_00,&local_530,local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_510);
  ::std::__cxx11::string::~string((string *)&local_510);
  ::std::__cxx11::string::~string((string *)&local_530);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_531);
  attr_01 = (TypedAttributeWithFallback<tinyusdz::Purpose> *)(ptStack_18 + 0x3a0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_578,"purpose",&local_579);
  uVar5 = local_1c + 1;
  print_typed_token_attr<tinyusdz::Purpose>(&local_558,attr_01,&local_578,uVar5);
  ::std::operator<<(aoStack_198,(string *)&local_558);
  ::std::__cxx11::string::~string((string *)&local_558);
  ::std::__cxx11::string::~string((string *)&local_578);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_579);
  print_xformOps_abi_cxx11_
            (&local_5a0,ptStack_18,
             (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)(ulong)(local_1c + 1),
             uVar5);
  ::std::operator<<(aoStack_198,(string *)&local_5a0);
  ::std::__cxx11::string::~string((string *)&local_5a0);
  print_props(&local_5c0,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(ptStack_18 + 0x1a98),local_1c + 1);
  ::std::operator<<(aoStack_198,(string *)&local_5c0);
  ::std::__cxx11::string::~string((string *)&local_5c0);
  if ((local_1d & 1) != 0) {
    pprint::Indent_abi_cxx11_(&local_5e0,(pprint *)(ulong)local_1c,n_02);
    poVar2 = ::std::operator<<(aoStack_198,(string *)&local_5e0);
    ::std::operator<<(poVar2,"}\n");
    ::std::__cxx11::string::~string((string *)&local_5e0);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const DistantLight &light, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(light.spec) << " DistantLight \""
     << light.name << "\"\n";
  if (light.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(light.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(light.color, "inputs:color", indent + 1);
  ss << print_typed_attr(light.colorTemperature, "inputs:colorTemperature",
                         indent + 1);
  ss << print_typed_attr(light.diffuse, "inputs:diffuse", indent + 1);
  ss << print_typed_attr(light.enableColorTemperature,
                         "inputs:enableColorTemperature", indent + 1);
  ss << print_typed_attr(light.exposure, "inputs:exposure", indent + 1);
  ss << print_typed_attr(light.intensity, "inputs:intensity", indent + 1);
  ss << print_typed_attr(light.normalize, "inputs:normalize", indent + 1);
  ss << print_typed_attr(light.specular, "inputs:specular", indent + 1);

  ss << print_typed_attr(light.angle, "inputs:angle", indent + 1);

  //ss << print_typed_attr(light.extent, "extent", indent + 1);
  ss << print_typed_token_attr(light.visibility, "visibility", indent + 1);
  ss << print_typed_token_attr(light.purpose, "purpose", indent + 1);

  ss << print_xformOps(light.xformOps, indent + 1);
  ss << print_props(light.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}